

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void __thiscall ImGuiMenuColumns::CalcNextTotalWidth(ImGuiMenuColumns *this,bool update_offsets)

{
  ImU16 IVar1;
  bool bVar2;
  int local_1c;
  ImU16 width;
  int i;
  bool want_spacing;
  ImU16 offset;
  bool update_offsets_local;
  ImGuiMenuColumns *this_local;
  
  i._0_2_ = 0;
  bVar2 = false;
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    IVar1 = this->Widths[local_1c];
    if ((bVar2) && (IVar1 != 0)) {
      i._0_2_ = (ushort)i + this->Spacing;
    }
    bVar2 = bVar2 || IVar1 != 0;
    if (update_offsets) {
      if (local_1c == 1) {
        this->OffsetLabel = (ushort)i;
      }
      if (local_1c == 2) {
        this->OffsetShortcut = (ushort)i;
      }
      if (local_1c == 3) {
        this->OffsetMark = (ushort)i;
      }
    }
    i._0_2_ = (ushort)i + IVar1;
  }
  this->NextTotalWidth = (uint)(ushort)i;
  return;
}

Assistant:

void ImGuiMenuColumns::CalcNextTotalWidth(bool update_offsets)
{
    ImU16 offset = 0;
    bool want_spacing = false;
    for (int i = 0; i < IM_ARRAYSIZE(Widths); i++)
    {
        ImU16 width = Widths[i];
        if (want_spacing && width > 0)
            offset += Spacing;
        want_spacing |= (width > 0);
        if (update_offsets)
        {
            if (i == 1) { OffsetLabel = offset; }
            if (i == 2) { OffsetShortcut = offset; }
            if (i == 3) { OffsetMark = offset; }
        }
        offset += width;
    }
    NextTotalWidth = offset;
}